

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O2

bool __thiscall
cmake::LoadCache(cmake *this,string *path,bool internal,
                set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *excludes,
                set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *includes)

{
  bool bVar1;
  long lVar2;
  allocator local_51;
  string local_50;
  
  bVar1 = cmState::LoadCache(this->State,path,internal,excludes,includes);
  for (lVar2 = 0; lVar2 != 0x10; lVar2 = lVar2 + 8) {
    std::__cxx11::string::string
              ((string *)&local_50,*(char **)((long)LoadCache::entries + lVar2),&local_51);
    UnwatchUnusedCli(this,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
  }
  return bVar1;
}

Assistant:

bool cmake::LoadCache(const std::string& path, bool internal,
                std::set<std::string>& excludes,
                std::set<std::string>& includes)
{
  bool result = this->State->LoadCache(path, internal, excludes, includes);
  static const char* entries[] = {"CMAKE_CACHE_MAJOR_VERSION",
                                  "CMAKE_CACHE_MINOR_VERSION"};
  for (const char* const* nameIt = cmArrayBegin(entries);
       nameIt != cmArrayEnd(entries); ++nameIt)
    {
    this->UnwatchUnusedCli(*nameIt);
    }
  return result;
}